

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O0

int coda_netcdf_cursor_goto_next_array_element(coda_cursor *cursor)

{
  coda_type *pcVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long *in_FS_OFFSET;
  long index;
  long num_elements;
  coda_cursor *cursor_local;
  
  if (*(int *)(*in_FS_OFFSET + -0x1208) != 0) {
    lVar3 = cursor->stack[cursor->n + -1].index + 1;
    pcVar1 = (cursor->stack[cursor->n + -2].type)->definition;
    lVar2._0_4_ = pcVar1[1].type_class;
    lVar2._4_4_ = pcVar1[1].read_type;
    if ((lVar3 < 0) || (lVar2 <= lVar3)) {
      coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)",lVar3,lVar2);
      return -1;
    }
  }
  iVar4 = cursor->n + -1;
  cursor->stack[iVar4].index = cursor->stack[iVar4].index + 1;
  return 0;
}

Assistant:

int coda_netcdf_cursor_goto_next_array_element(coda_cursor *cursor)
{
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;
        long index;

        index = cursor->stack[cursor->n - 1].index + 1;
        num_elements = ((coda_type_array *)cursor->stack[cursor->n - 2].type->definition)->num_elements;
        if (index < 0 || index >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", index,
                           num_elements);
            return -1;
        }
    }

    cursor->stack[cursor->n - 1].index++;

    return 0;
}